

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

int fits_read_rgnfile(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  int iVar1;
  int tstatus;
  fitsfile *fptr;
  int local_2c;
  fitsfile *local_28;
  
  local_2c = 0;
  iVar1 = *status;
  if (iVar1 == 0) {
    ffpmrk();
    iVar1 = ffopen(&local_28,filename,0,&local_2c);
    if (iVar1 == 0) {
      fits_read_fits_region(local_28,wcs,Rgn,status);
    }
    else {
      ffcmrk();
      fits_read_ascii_region(filename,wcs,Rgn,status);
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fits_read_rgnfile( const char *filename,
            WCSdata    *wcs,
            SAORegion  **Rgn,
            int        *status )
/*  Read regions from either a FITS or ASCII region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
  fitsfile *fptr;
  int tstatus = 0;

  if( *status ) return( *status );

  /* try to open as a FITS file - if that doesn't work treat as an ASCII file */

  fits_write_errmark();
  if ( ffopen(&fptr, filename, READONLY, &tstatus) ) {
    fits_clear_errmark();
    fits_read_ascii_region(filename, wcs, Rgn, status);
  } else {
    fits_read_fits_region(fptr, wcs, Rgn, status);
  }

  return(*status);

}